

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O2

bool __thiscall
ON_Viewport::GetFrustumLine(ON_Viewport *this,double screenx,double screeny,ON_Line *world_line)

{
  bool bVar1;
  ON_Line line;
  ON_3dPoint local_170;
  double local_158;
  double local_148;
  ON_3dPoint local_138;
  ON_Xform s2c;
  ON_Xform c2w;
  
  local_158 = screeny;
  local_148 = screenx;
  ON_Xform::ON_Xform(&s2c);
  ON_Xform::ON_Xform(&c2w);
  ON_Line::ON_Line(&line);
  bVar1 = GetXform(this,screen_cs,clip_cs,&s2c);
  if (bVar1) {
    bVar1 = GetXform(this,clip_cs,world_cs,&c2w);
    if (bVar1) {
      local_138.x = s2c.m_xform[0][3] +
                    local_148 * s2c.m_xform[0][0] + local_158 * s2c.m_xform[0][1];
      local_138.y = s2c.m_xform[1][3] +
                    local_148 * s2c.m_xform[1][0] + local_158 * s2c.m_xform[1][1];
      local_138.z = 1.0;
      ON_Xform::operator*(&local_170,&c2w,&local_138);
      line.to.z = local_170.z;
      line.to.x = local_170.x;
      line.to.y = local_170.y;
      local_138.z = -1.0;
      ON_Xform::operator*(&local_170,&c2w,&local_138);
      line.from.z = local_170.z;
      line.from.x = local_170.x;
      line.from.y = local_170.y;
      (world_line->to).y = line.to.y;
      (world_line->to).z = line.to.z;
      (world_line->from).z = local_170.z;
      (world_line->to).x = line.to.x;
      (world_line->from).x = local_170.x;
      (world_line->from).y = local_170.y;
      bVar1 = true;
      goto LAB_0066687e;
    }
  }
  bVar1 = false;
LAB_0066687e:
  ON_Line::~ON_Line(&line);
  return bVar1;
}

Assistant:

bool ON_Viewport::GetFrustumLine( double screenx, double screeny, ON_Line& world_line ) const
{
  ON_Xform s2c, c2w;
  ON_3dPoint c;
  ON_Line line;
  bool rc;

  rc = GetXform( ON::screen_cs, ON::clip_cs, s2c );
  if ( rc )
    rc = GetXform( ON::clip_cs, ON::world_cs, c2w );
  if (rc )
  {
    // c = mouse point on near clipping plane
    c.x = s2c.m_xform[0][0]*screenx + s2c.m_xform[0][1]*screeny + s2c.m_xform[0][3];
    c.y = s2c.m_xform[1][0]*screenx + s2c.m_xform[1][1]*screeny + s2c.m_xform[1][3];
    c.z = 1.0;
    line.to = c2w*c;   // line.to = near plane mouse point in world coords
    c.z = -1.0;
    line.from = c2w*c; // line.from = far plane mouse point in world coords

    world_line = line;
  }
  return rc;
}